

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

bool __thiscall ViconDataStreamSDK::Core::VClient::IsEyeTrackerDevice(VClient *this,uint i_DeviceID)

{
  pointer pVVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  scoped_lock Lock;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  pVVar1 = (this->m_LatestFrame).m_EyeTrackers.
           super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_LatestFrame).m_EyeTrackers.
                super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar4 == 0) {
    bVar6 = false;
  }
  else {
    uVar2 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
    uVar3 = 1;
    uVar5 = 0;
    do {
      bVar6 = pVVar1[uVar5].m_DeviceID == i_DeviceID;
      if (bVar6) break;
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return bVar6;
}

Assistant:

bool VClient::IsEyeTrackerDevice(unsigned int i_DeviceID) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  for( unsigned int i = 0; i < m_LatestFrame.m_EyeTrackers.size(); i++ )
  {
    if( m_LatestFrame.m_EyeTrackers[ i ].m_DeviceID == i_DeviceID )
    {
      return true;
    }
  }

  return false;
}